

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatSoldier.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatSoldier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_EnhancedGroundCombatSoldier *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  GED_BasicGroundCombatSoldier::GetAsString_abi_cxx11_
            (&local_1c0,&this->super_GED_BasicGroundCombatSoldier);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar1 = std::operator<<(local_190,"GED Enhanced Ground Combat Vehicle\n");
  poVar1 = std::operator<<(poVar1,"\tWater Status:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8WaterStatus);
  poVar1 = std::operator<<(poVar1," ounce/s\n");
  poVar1 = std::operator<<(poVar1,"\tRest Status:          ");
  ENUMS::GetEnumAsStringRestStatus_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui8RestStatus,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tPrimary Ammunition:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8PriAmmun);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSecondary Ammunition: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SecAmmun);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GED_EnhancedGroundCombatSoldier::GetAsString() const
{
    KStringStream ss;

    ss << GED_BasicGroundCombatSoldier::GetAsString();

    ss << "GED Enhanced Ground Combat Vehicle\n"
       << "\tWater Status:         " << ( KUINT16 )m_ui8WaterStatus                  << " ounce/s\n"
       << "\tRest Status:          " << GetEnumAsStringRestStatus( m_ui8RestStatus ) << "\n"
       << "\tPrimary Ammunition:   " << ( KUINT16 )m_ui8PriAmmun                     << "\n"
       << "\tSecondary Ammunition: " << ( KUINT16 )m_ui8SecAmmun                     << "\n";

    return ss.str();
}